

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QMimeMagicRule>::emplace<QMimeMagicRule>
          (QMovableArrayOps<QMimeMagicRule> *this,qsizetype i,QMimeMagicRule *args)

{
  QMimeMagicRule **ppQVar1;
  qsizetype *pqVar2;
  Type TVar3;
  Data *pDVar4;
  QMimeMagicRule *pQVar5;
  qsizetype qVar6;
  QMimeMagicRule *pQVar7;
  Data *pDVar8;
  char *pcVar9;
  MatchFunction MVar10;
  int iVar11;
  quint32 qVar12;
  QTypedArrayData<QMimeMagicRule> *__old_val;
  longlong __old_val_1;
  long in_FS_OFFSET;
  bool bVar13;
  QArrayDataPointer<QMimeMagicRule> local_c0;
  Type local_a8;
  undefined4 uStack_a4;
  Data *local_a0;
  char *pcStack_98;
  qsizetype local_90;
  undefined8 uStack_88;
  Data *local_80;
  char *pcStack_78;
  qsizetype local_70;
  Data *local_68;
  char *pcStack_60;
  qsizetype local_58;
  undefined8 local_50;
  MatchFunction MStack_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QMimeMagicRule>).super_QArrayDataPointer<QMimeMagicRule>.d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (__int_type_conflict)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_004b60e9:
    pDVar4 = (args->m_subMatches).d.d;
    (args->m_subMatches).d.d = (Data *)0x0;
    local_c0.ptr = (args->m_subMatches).d.ptr;
    (args->m_subMatches).d.ptr = (QMimeMagicRule *)0x0;
    qVar6 = (args->m_subMatches).d.size;
    (args->m_subMatches).d.size = 0;
    TVar3 = args->m_type;
    _local_a8 = CONCAT44(0xaaaaaaaa,TVar3);
    local_a0 = (args->m_value).d.d;
    pcStack_98 = (args->m_value).d.ptr;
    (args->m_value).d.d = (Data *)0x0;
    (args->m_value).d.ptr = (char *)0x0;
    local_90 = (args->m_value).d.size;
    uStack_88._0_4_ = args->m_startPos;
    uStack_88._4_4_ = args->m_endPos;
    (args->m_value).d.size = 0;
    local_80 = (args->m_mask).d.d;
    pcStack_78 = (args->m_mask).d.ptr;
    (args->m_mask).d.d = (Data *)0x0;
    (args->m_mask).d.ptr = (char *)0x0;
    local_70 = (args->m_mask).d.size;
    (args->m_mask).d.size = 0;
    local_68 = (args->m_pattern).d.d;
    pcStack_60 = (args->m_pattern).d.ptr;
    (args->m_pattern).d.d = (Data *)0x0;
    (args->m_pattern).d.ptr = (char *)0x0;
    local_58 = (args->m_pattern).d.size;
    (args->m_pattern).d.size = 0;
    local_50._0_4_ = args->m_number;
    local_50._4_4_ = args->m_numberMask;
    MStack_48 = args->m_matchFunction;
    local_40 = *(undefined8 *)&args->field_0x80;
    bVar13 = (this->super_QGenericArrayOps<QMimeMagicRule>).super_QArrayDataPointer<QMimeMagicRule>.
             size != 0;
    local_c0.d = pDVar4;
    local_c0.size = qVar6;
    QArrayDataPointer<QMimeMagicRule>::detachAndGrow
              ((QArrayDataPointer<QMimeMagicRule> *)this,(uint)(i == 0 && bVar13),1,
               (QMimeMagicRule **)0x0,(QArrayDataPointer<QMimeMagicRule> *)0x0);
    pQVar5 = (this->super_QGenericArrayOps<QMimeMagicRule>).super_QArrayDataPointer<QMimeMagicRule>.
             ptr;
    if (i == 0 && bVar13) {
      pQVar5[-1].m_subMatches.d.d = pDVar4;
      pQVar5[-1].m_subMatches.d.ptr = local_c0.ptr;
      pQVar5[-1].m_subMatches.d.size = qVar6;
      pQVar5[-1].m_type = TVar3;
      pQVar5[-1].m_value.d.d = local_a0;
      pQVar5[-1].m_value.d.ptr = pcStack_98;
      pQVar5[-1].m_value.d.size = local_90;
      pQVar5[-1].m_startPos = (undefined4)uStack_88;
      pQVar5[-1].m_endPos = uStack_88._4_4_;
      pQVar5[-1].m_mask.d.d = local_80;
      pQVar5[-1].m_mask.d.ptr = pcStack_78;
      pQVar5[-1].m_mask.d.size = local_70;
      pQVar5[-1].m_pattern.d.d = local_68;
      pQVar5[-1].m_pattern.d.ptr = pcStack_60;
      pQVar5[-1].m_pattern.d.size = local_58;
      pQVar5[-1].m_number = (undefined4)local_50;
      pQVar5[-1].m_numberMask = local_50._4_4_;
      pQVar5[-1].m_matchFunction = MStack_48;
      *(undefined8 *)&pQVar5[-1].field_0x80 = local_40;
      ppQVar1 = &(this->super_QGenericArrayOps<QMimeMagicRule>).
                 super_QArrayDataPointer<QMimeMagicRule>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    else {
      pQVar7 = pQVar5 + i;
      memmove(pQVar7 + 1,pQVar5 + i,
              ((this->super_QGenericArrayOps<QMimeMagicRule>).
               super_QArrayDataPointer<QMimeMagicRule>.size - i) * 0x88);
      (pQVar7->m_subMatches).d.d = pDVar4;
      (pQVar7->m_subMatches).d.ptr = local_c0.ptr;
      (pQVar7->m_subMatches).d.size = qVar6;
      pQVar7->m_type = TVar3;
      (pQVar7->m_value).d.d = local_a0;
      (pQVar7->m_value).d.ptr = pcStack_98;
      (pQVar7->m_value).d.size = local_90;
      pQVar7->m_startPos = (undefined4)uStack_88;
      pQVar7->m_endPos = uStack_88._4_4_;
      (pQVar7->m_mask).d.d = local_80;
      (pQVar7->m_mask).d.ptr = pcStack_78;
      (pQVar7->m_mask).d.size = local_70;
      (pQVar7->m_pattern).d.d = local_68;
      (pQVar7->m_pattern).d.ptr = pcStack_60;
      (pQVar7->m_pattern).d.size = local_58;
      pQVar7->m_number = (undefined4)local_50;
      pQVar7->m_numberMask = local_50._4_4_;
      pQVar7->m_matchFunction = MStack_48;
      *(undefined8 *)&pQVar7->field_0x80 = local_40;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QMimeMagicRule>).super_QArrayDataPointer<QMimeMagicRule>
              .size;
    *pqVar2 = *pqVar2 + 1;
    local_58 = 0;
    pcStack_60 = (char *)0x0;
    local_68 = (Data *)0x0;
    local_70 = 0;
    pcStack_78 = (char *)0x0;
    local_80 = (Data *)0x0;
    local_90 = 0;
    pcStack_98 = (char *)0x0;
    local_a0 = (Data *)0x0;
    local_c0.size = 0;
    local_c0.ptr = (QMimeMagicRule *)0x0;
    local_c0.d = (Data *)0x0;
    QArrayDataPointer<QMimeMagicRule>::~QArrayDataPointer(&local_c0);
  }
  else {
    if (((this->super_QGenericArrayOps<QMimeMagicRule>).super_QArrayDataPointer<QMimeMagicRule>.size
         == i) &&
       (pQVar5 = (this->super_QGenericArrayOps<QMimeMagicRule>).
                 super_QArrayDataPointer<QMimeMagicRule>.ptr,
       (pDVar4->super_QArrayData).alloc - i !=
       ((long)((long)pQVar5 -
              ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
       -0xf0f0f0f0f0f0f0f)) {
      pDVar4 = (args->m_subMatches).d.d;
      (args->m_subMatches).d.d = (Data *)0x0;
      pQVar5[i].m_subMatches.d.d = pDVar4;
      pQVar7 = (args->m_subMatches).d.ptr;
      (args->m_subMatches).d.ptr = (QMimeMagicRule *)0x0;
      pQVar5[i].m_subMatches.d.ptr = pQVar7;
      qVar6 = (args->m_subMatches).d.size;
      (args->m_subMatches).d.size = 0;
      pQVar5[i].m_subMatches.d.size = qVar6;
      pQVar5[i].m_type = args->m_type;
      pDVar8 = (args->m_value).d.d;
      (args->m_value).d.d = (Data *)0x0;
      pQVar5[i].m_value.d.d = pDVar8;
      pcVar9 = (args->m_value).d.ptr;
      (args->m_value).d.ptr = (char *)0x0;
      pQVar5[i].m_value.d.ptr = pcVar9;
      qVar6 = (args->m_value).d.size;
      (args->m_value).d.size = 0;
      pQVar5[i].m_value.d.size = qVar6;
      iVar11 = args->m_endPos;
      pQVar5[i].m_startPos = args->m_startPos;
      pQVar5[i].m_endPos = iVar11;
      pDVar8 = (args->m_mask).d.d;
      (args->m_mask).d.d = (Data *)0x0;
      pQVar5[i].m_mask.d.d = pDVar8;
      pcVar9 = (args->m_mask).d.ptr;
      (args->m_mask).d.ptr = (char *)0x0;
      pQVar5[i].m_mask.d.ptr = pcVar9;
      qVar6 = (args->m_mask).d.size;
      (args->m_mask).d.size = 0;
      pQVar5[i].m_mask.d.size = qVar6;
      pDVar8 = (args->m_pattern).d.d;
      (args->m_pattern).d.d = (Data *)0x0;
      pQVar5[i].m_pattern.d.d = pDVar8;
      pcVar9 = (args->m_pattern).d.ptr;
      (args->m_pattern).d.ptr = (char *)0x0;
      pQVar5[i].m_pattern.d.ptr = pcVar9;
      qVar6 = (args->m_pattern).d.size;
      (args->m_pattern).d.size = 0;
      pQVar5[i].m_pattern.d.size = qVar6;
      qVar12 = args->m_numberMask;
      MVar10 = args->m_matchFunction;
      pQVar7 = pQVar5 + i;
      pQVar7->m_number = args->m_number;
      pQVar7->m_numberMask = qVar12;
      *(MatchFunction *)(&pQVar7->m_number + 2) = MVar10;
      *(undefined8 *)&pQVar5[i].field_0x80 = *(undefined8 *)&args->field_0x80;
    }
    else {
      if ((i != 0) ||
         (pQVar5 = (this->super_QGenericArrayOps<QMimeMagicRule>).
                   super_QArrayDataPointer<QMimeMagicRule>.ptr,
         (QMimeMagicRule *)
         ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) == pQVar5))
      goto LAB_004b60e9;
      pDVar4 = (args->m_subMatches).d.d;
      (args->m_subMatches).d.d = (Data *)0x0;
      pQVar5[-1].m_subMatches.d.d = pDVar4;
      pQVar7 = (args->m_subMatches).d.ptr;
      (args->m_subMatches).d.ptr = (QMimeMagicRule *)0x0;
      pQVar5[-1].m_subMatches.d.ptr = pQVar7;
      qVar6 = (args->m_subMatches).d.size;
      (args->m_subMatches).d.size = 0;
      pQVar5[-1].m_subMatches.d.size = qVar6;
      pQVar5[-1].m_type = args->m_type;
      pDVar8 = (args->m_value).d.d;
      (args->m_value).d.d = (Data *)0x0;
      pQVar5[-1].m_value.d.d = pDVar8;
      pcVar9 = (args->m_value).d.ptr;
      (args->m_value).d.ptr = (char *)0x0;
      pQVar5[-1].m_value.d.ptr = pcVar9;
      qVar6 = (args->m_value).d.size;
      (args->m_value).d.size = 0;
      pQVar5[-1].m_value.d.size = qVar6;
      iVar11 = args->m_endPos;
      pQVar5[-1].m_startPos = args->m_startPos;
      pQVar5[-1].m_endPos = iVar11;
      pDVar8 = (args->m_mask).d.d;
      (args->m_mask).d.d = (Data *)0x0;
      pQVar5[-1].m_mask.d.d = pDVar8;
      pcVar9 = (args->m_mask).d.ptr;
      (args->m_mask).d.ptr = (char *)0x0;
      pQVar5[-1].m_mask.d.ptr = pcVar9;
      qVar6 = (args->m_mask).d.size;
      (args->m_mask).d.size = 0;
      pQVar5[-1].m_mask.d.size = qVar6;
      pDVar8 = (args->m_pattern).d.d;
      (args->m_pattern).d.d = (Data *)0x0;
      pQVar5[-1].m_pattern.d.d = pDVar8;
      pcVar9 = (args->m_pattern).d.ptr;
      (args->m_pattern).d.ptr = (char *)0x0;
      pQVar5[-1].m_pattern.d.ptr = pcVar9;
      qVar6 = (args->m_pattern).d.size;
      (args->m_pattern).d.size = 0;
      pQVar5[-1].m_pattern.d.size = qVar6;
      qVar12 = args->m_numberMask;
      MVar10 = args->m_matchFunction;
      pQVar5[-1].m_number = args->m_number;
      pQVar5[-1].m_numberMask = qVar12;
      pQVar5[-1].m_matchFunction = MVar10;
      *(undefined8 *)&pQVar5[-1].field_0x80 = *(undefined8 *)&args->field_0x80;
      ppQVar1 = &(this->super_QGenericArrayOps<QMimeMagicRule>).
                 super_QArrayDataPointer<QMimeMagicRule>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QMimeMagicRule>).super_QArrayDataPointer<QMimeMagicRule>
              .size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }